

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::SetTrimTolerances(ON_Brep *this,bool bLazy)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  
  uVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  uVar5 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar5;
  }
  bVar4 = true;
  for (; uVar3 * 0xe8 - uVar5 != 0; uVar5 = uVar5 + 0xe8) {
    iVar2 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])
                      (this,(long)&(((ON_CurveProxy *)
                                    (&(((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                        super_ON_ClassArray<ON_BrepTrim>.m_a)->super_ON_CurveProxy).
                                      m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                                   super_ON_Object._vptr_ON_Object + uVar5,(ulong)bLazy);
    bVar4 = (bool)(bVar4 & (byte)iVar2);
  }
  return bVar4;
}

Assistant:

bool ON_Brep::SetTrimTolerances( bool bLazy )
{
  bool rc = true;
  int ti, trim_count = m_T.Count();
  for ( ti = 0; ti < trim_count; ti++ )
  {
    if ( !SetTrimTolerance( m_T[ti], bLazy ) )
      rc = false;
  }
  return rc;
}